

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alpha_enc.c
# Opt level: O1

int CompressAlphaJob(void *arg1,void *unused)

{
  uint method;
  uint uVar1;
  uint dst_stride;
  uint height;
  undefined4 uVar2;
  WebPPicture *pic;
  WebPAuxStats *pWVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [14];
  undefined1 auVar6 [12];
  unkbyte10 Var7;
  int iVar8;
  WEBP_FILTER_TYPE WVar9;
  uint8_t *dst;
  ulong uVar10;
  long lVar11;
  uint8_t *puVar12;
  ulong uVar13;
  char cVar14;
  int iVar15;
  WebPEncodingError error;
  uint uVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar29 [16];
  undefined1 auVar32 [16];
  uint64_t local_238;
  size_t local_230;
  FilterTrial best;
  FilterTrial local_128;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar30 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar31 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined2 uVar33;
  
  lVar11 = *arg1;
  pic = *(WebPPicture **)((long)arg1 + 8);
  iVar15 = *(int *)(lVar11 + 8);
  method = *(uint *)(lVar11 + 0x30);
  uVar1 = *(uint *)(lVar11 + 0x38);
  dst_stride = pic->width;
  height = pic->height;
  local_238 = 0;
  if ((uVar1 < 0x65) && (method < 2)) {
    cVar14 = (*(int *)(lVar11 + 0x34) == 1) + '\x05';
    if (*(int *)(lVar11 + 0x34) == 0) {
      cVar14 = '\0';
    }
    local_230 = (size_t)(int)(height * dst_stride);
    if (method == 0) {
      cVar14 = '\0';
    }
    dst = (uint8_t *)WebPSafeMalloc(1,local_230);
    if (dst != (uint8_t *)0x0) {
      WebPCopyPlane(pic->a,pic->a_stride,dst,dst_stride,dst_stride,height);
      if ((int)uVar1 < 100) {
        if ((int)uVar1 < 0x47) {
          iVar8 = uVar1 / 5 + 2;
        }
        else {
          iVar8 = uVar1 * 8 + -0x220;
        }
        iVar8 = QuantizeLevels(dst,dst_stride,height,iVar8,&local_238);
        if (iVar8 != 0) goto LAB_0013426c;
        puVar12 = (uint8_t *)0x0;
        uVar10 = 0;
        iVar8 = 0;
      }
      else {
LAB_0013426c:
        VP8FiltersInit();
        pWVar3 = pic->stats;
        if (cVar14 == '\0') {
          uVar16 = 1;
        }
        else if (cVar14 == '\x06') {
          memset(&best,0,0x100);
          if (0 < (int)height) {
            uVar10 = 0;
            puVar12 = dst;
            do {
              if (0 < (int)dst_stride) {
                uVar13 = 0;
                do {
                  *(undefined1 *)((long)best.stats.PSNR + ((ulong)puVar12[uVar13] - 0x3c)) = 1;
                  uVar13 = uVar13 + 1;
                } while (dst_stride != uVar13);
              }
              uVar10 = uVar10 + 1;
              puVar12 = puVar12 + (int)dst_stride;
            } while (uVar10 != height);
          }
          lVar11 = 0;
          iVar8 = 0;
          iVar17 = 0;
          iVar18 = 0;
          iVar19 = 0;
          do {
            uVar2 = *(undefined4 *)((long)best.stats.PSNR + lVar11 + -0x3c);
            auVar20[0] = -((char)uVar2 == '\0');
            auVar20[1] = -((char)((uint)uVar2 >> 8) == '\0');
            auVar20[2] = -((char)((uint)uVar2 >> 0x10) == '\0');
            auVar20[3] = -((char)((uint)uVar2 >> 0x18) == '\0');
            auVar20[4] = 0xff;
            auVar20[5] = 0xff;
            auVar20[6] = 0xff;
            auVar20[7] = 0xff;
            auVar20[8] = 0xff;
            auVar20[9] = 0xff;
            auVar20[10] = 0xff;
            auVar20[0xb] = 0xff;
            auVar20[0xc] = 0xff;
            auVar20[0xd] = 0xff;
            auVar20[0xe] = 0xff;
            auVar20[0xf] = 0xff;
            auVar4._8_4_ = 0xffffffff;
            auVar4._0_8_ = 0xffffffffffffffff;
            auVar4._12_4_ = 0xffffffff;
            auVar20 = auVar20 ^ auVar4;
            auVar28._0_14_ = auVar20._0_14_;
            auVar28[0xe] = auVar20[7];
            auVar28[0xf] = auVar20[7];
            auVar27._14_2_ = auVar28._14_2_;
            auVar27._0_13_ = auVar20._0_13_;
            auVar27[0xd] = auVar20[6];
            auVar26._13_3_ = auVar27._13_3_;
            auVar26._0_12_ = auVar20._0_12_;
            auVar26[0xc] = auVar20[6];
            auVar25._12_4_ = auVar26._12_4_;
            auVar25._0_11_ = auVar20._0_11_;
            auVar25[0xb] = auVar20[5];
            auVar24._11_5_ = auVar25._11_5_;
            auVar24._0_10_ = auVar20._0_10_;
            auVar24[10] = auVar20[5];
            auVar23._10_6_ = auVar24._10_6_;
            auVar23._0_9_ = auVar20._0_9_;
            auVar23[9] = auVar20[4];
            auVar22._9_7_ = auVar23._9_7_;
            auVar22._0_8_ = auVar20._0_8_;
            auVar22[8] = auVar20[4];
            Var7 = CONCAT91(CONCAT81(auVar22._8_8_,auVar20[3]),auVar20[3]);
            auVar6._2_10_ = Var7;
            auVar6[1] = auVar20[2];
            auVar6[0] = auVar20[2];
            auVar5._2_12_ = auVar6;
            auVar5[1] = auVar20[1];
            auVar5[0] = auVar20[1];
            auVar21._0_2_ = CONCAT11(auVar20[0],auVar20[0]);
            auVar21._2_14_ = auVar5;
            uVar33 = (undefined2)Var7;
            auVar31._0_12_ = auVar21._0_12_;
            auVar31._12_2_ = uVar33;
            auVar31._14_2_ = uVar33;
            auVar30._12_4_ = auVar31._12_4_;
            auVar30._0_10_ = auVar21._0_10_;
            auVar30._10_2_ = auVar6._0_2_;
            auVar29._10_6_ = auVar30._10_6_;
            auVar29._0_8_ = auVar21._0_8_;
            auVar29._8_2_ = auVar6._0_2_;
            auVar32._8_8_ = auVar29._8_8_;
            auVar32._6_2_ = auVar5._0_2_;
            auVar32._4_2_ = auVar5._0_2_;
            auVar32._2_2_ = auVar21._0_2_;
            auVar32._0_2_ = auVar21._0_2_;
            auVar32 = auVar32 & _DAT_001b6870;
            iVar8 = iVar8 + auVar32._0_4_;
            iVar17 = iVar17 + auVar32._4_4_;
            iVar18 = iVar18 + auVar32._8_4_;
            iVar19 = iVar19 + auVar32._12_4_;
            lVar11 = lVar11 + 4;
          } while (lVar11 != 0x100);
          uVar16 = iVar19 + iVar17 + iVar18 + iVar8;
          WVar9 = WEBP_FILTER_NONE;
          if (0x10 < uVar16) {
            WVar9 = WebPEstimateBestFilter(dst,dst_stride,height,dst_stride);
          }
          uVar16 = (uint)(0xc0 < uVar16 || 3 < iVar15) | 1 << (WVar9 & 0x1f);
        }
        else {
          uVar16 = 0xf;
        }
        best.score = 0xffffffff;
        VP8BitWriterInit(&best.bw,0);
        if (uVar16 == 1) {
          iVar8 = EncodeAlphaInternal(dst,dst_stride,height,method,0,(uint)((int)uVar1 < 100),iVar15
                                      ,(uint8_t *)0x0,&best);
LAB_001344b3:
          if (iVar8 == 0) {
            VP8BitWriterWipeOut(&best.bw);
            uVar10 = 0;
            puVar12 = (uint8_t *)0x0;
          }
          else {
            uVar10 = best.bw.pos;
            puVar12 = best.bw.buf;
            if (pWVar3 != (WebPAuxStats *)0x0) {
              pWVar3->cross_color_transform_bits = best.stats.cross_color_transform_bits;
              pWVar3->lossless_features = best.stats.lossless_features;
              pWVar3->histogram_bits = best.stats.histogram_bits;
              pWVar3->transform_bits = best.stats.transform_bits;
              pWVar3->cache_bits = best.stats.cache_bits;
              pWVar3->palette_size = best.stats.palette_size;
              pWVar3->lossless_size = best.stats.lossless_size;
              pWVar3->lossless_hdr_size = best.stats.lossless_hdr_size;
              pWVar3->lossless_data_size = best.stats.lossless_data_size;
            }
          }
        }
        else {
          puVar12 = (uint8_t *)WebPSafeMalloc(1,local_230);
          if (puVar12 == (uint8_t *)0x0) {
            iVar8 = 1;
          }
          else {
            iVar17 = 0;
            do {
              iVar8 = 1;
              if ((uVar16 & 1) != 0) {
                iVar8 = EncodeAlphaInternal(dst,dst_stride,height,method,iVar17,
                                            (uint)((int)uVar1 < 100),iVar15,puVar12,&local_128);
                if ((iVar8 == 0) || (best.score <= local_128.score)) {
                  VP8BitWriterWipeOut(&local_128.bw);
                }
                else {
                  VP8BitWriterWipeOut(&best.bw);
                  memcpy(&best,&local_128,0xf8);
                }
              }
              if (uVar16 < 2) break;
              iVar17 = iVar17 + 1;
              uVar16 = uVar16 >> 1;
            } while (iVar8 != 0);
            WebPSafeFree(puVar12);
          }
          if (puVar12 != (uint8_t *)0x0) goto LAB_001344b3;
          iVar8 = 0;
          uVar10 = 0;
          puVar12 = (uint8_t *)0x0;
        }
        if (iVar8 == 0) {
          WebPEncodingSetError(pic,VP8_ENC_ERROR_OUT_OF_MEMORY);
        }
        pWVar3 = pic->stats;
        if (pWVar3 != (WebPAuxStats *)0x0) {
          pWVar3->coded_size = pWVar3->coded_size + (int)uVar10;
          *(uint64_t *)((long)arg1 + 0x5bf0) = local_238;
        }
      }
      WebPSafeFree(dst);
      goto LAB_0013417c;
    }
    error = VP8_ENC_ERROR_OUT_OF_MEMORY;
  }
  else {
    error = VP8_ENC_ERROR_INVALID_CONFIGURATION;
  }
  iVar8 = WebPEncodingSetError(pic,error);
  puVar12 = (uint8_t *)0x0;
  uVar10 = 0;
LAB_0013417c:
  iVar15 = 0;
  if (iVar8 != 0) {
    if (uVar10 >> 0x20 == 0) {
      *(int *)((long)arg1 + 0x228) = (int)uVar10;
      *(uint8_t **)((long)arg1 + 0x220) = puVar12;
      iVar15 = 1;
    }
    else {
      WebPSafeFree(puVar12);
      iVar15 = 0;
    }
  }
  return iVar15;
}

Assistant:

static int CompressAlphaJob(void* arg1, void* unused) {
  VP8Encoder* const enc = (VP8Encoder*)arg1;
  const WebPConfig* config = enc->config;
  uint8_t* alpha_data = NULL;
  size_t alpha_size = 0;
  const int effort_level = config->method;  // maps to [0..6]
  const WEBP_FILTER_TYPE filter =
      (config->alpha_filtering == 0) ? WEBP_FILTER_NONE :
      (config->alpha_filtering == 1) ? WEBP_FILTER_FAST :
                                       WEBP_FILTER_BEST;
  if (!EncodeAlpha(enc, config->alpha_quality, config->alpha_compression,
                   filter, effort_level, &alpha_data, &alpha_size)) {
    return 0;
  }
  if (alpha_size != (uint32_t)alpha_size) {  // Soundness check.
    WebPSafeFree(alpha_data);
    return 0;
  }
  enc->alpha_data_size = (uint32_t)alpha_size;
  enc->alpha_data = alpha_data;
  (void)unused;
  return 1;
}